

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O2

bool __thiscall
cppcms::sessions::session_file_storage::read_all(session_file_storage *this,int fd,void *vbuf,int n)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  uint uVar4;
  
  while (uVar4 = n, 0 < (int)uVar4) {
    while( true ) {
      sVar2 = read(fd,vbuf,(ulong)uVar4);
      iVar1 = (int)sVar2;
      if (-1 < iVar1) break;
      piVar3 = __errno_location();
      if ((*piVar3 != 4) || ((int)uVar4 < 1)) goto LAB_002600b1;
    }
    n = uVar4 - iVar1;
    if (iVar1 == 0) break;
  }
LAB_002600b1:
  return (int)uVar4 < 1;
}

Assistant:

bool session_file_storage::read_all(int fd,void *vbuf,int n)
{
	char *buf=reinterpret_cast<char *>(vbuf);
	while(n > 0) {
		int res = ::read(fd,buf,n);
		if(res < 0 && errno==EINTR)
			continue;
		if(res <= 0)
			return false;
		n-=res;
	}
	return true;
}